

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

int __thiscall Catch::TablePrinter::open(TablePrinter *this,char *__file,int __oflag,...)

{
  pointer pCVar1;
  ostream *poVar2;
  int in_EAX;
  int extraout_EAX;
  size_t sVar3;
  ostream *poVar4;
  size_t sVar5;
  pointer text;
  Columns headerCols;
  Spacer spacer;
  Columns local_a8;
  Column local_90;
  value_type local_60;
  
  if (this->m_isOpen == false) {
    this->m_isOpen = true;
    if (0 < this->m_currentColumn) {
      local_60.m_strings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this->m_os,(char *)&local_60,1);
      this->m_currentColumn = -1;
    }
    local_a8.m_columns.
    super__Vector_base<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.m_columns.
    super__Vector_base<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8.m_columns.
    super__Vector_base<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    clara::TextFlow::Spacer::Spacer((Spacer *)&local_60,2);
    text = (this->m_columnInfos).
           super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
    pCVar1 = (this->m_columnInfos).
             super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (text != pCVar1) {
      do {
        clara::TextFlow::Column::Column(&local_90,&text->name);
        sVar3 = (long)text->width - 2;
        if ((int)sVar3 == 0) {
          __assert_fail("newWidth > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/catch2/catch.hpp"
                        ,0x21b0,"Column &Catch::clara::TextFlow::Column::width(size_t)");
        }
        local_90.m_width = sVar3;
        clara::std::
        vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>::
        push_back(&local_a8.m_columns,&local_90);
        clara::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_90.m_strings);
        clara::std::
        vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>::
        push_back(&local_a8.m_columns,&local_60);
        text = text + 1;
      } while (text != pCVar1);
    }
    poVar4 = clara::TextFlow::operator<<(this->m_os,&local_a8);
    local_90.m_strings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,(char *)&local_90,1);
    poVar2 = (ostream *)this->m_os;
    if (getLineOfChars<(char)45>()::line == '\0') {
      uRam00000000001912f0 = 0x2d2d2d2d2d2d2d;
      uRam00000000001912f7._0_1_ = '-';
      uRam00000000001912f7._1_1_ = '-';
      uRam00000000001912f7._2_1_ = '-';
      uRam00000000001912f7._3_1_ = '-';
      uRam00000000001912f7._4_1_ = '-';
      uRam00000000001912f7._5_1_ = '-';
      uRam00000000001912f7._6_1_ = '-';
      uRam00000000001912f7._7_1_ = '-';
      DAT_001912e0 = '-';
      DAT_001912e0_1._0_1_ = '-';
      DAT_001912e0_1._1_1_ = '-';
      DAT_001912e0_1._2_1_ = '-';
      DAT_001912e0_1._3_1_ = '-';
      DAT_001912e0_1._4_1_ = '-';
      DAT_001912e0_1._5_1_ = '-';
      DAT_001912e0_1._6_1_ = '-';
      uRam00000000001912e8 = 0x2d2d2d2d2d2d2d;
      DAT_001912ef = 0x2d;
      DAT_001912d0 = '-';
      DAT_001912d0_1._0_1_ = '-';
      DAT_001912d0_1._1_1_ = '-';
      DAT_001912d0_1._2_1_ = '-';
      DAT_001912d0_1._3_1_ = '-';
      DAT_001912d0_1._4_1_ = '-';
      DAT_001912d0_1._5_1_ = '-';
      DAT_001912d0_1._6_1_ = '-';
      uRam00000000001912d8._0_1_ = '-';
      uRam00000000001912d8._1_1_ = '-';
      uRam00000000001912d8._2_1_ = '-';
      uRam00000000001912d8._3_1_ = '-';
      uRam00000000001912d8._4_1_ = '-';
      uRam00000000001912d8._5_1_ = '-';
      uRam00000000001912d8._6_1_ = '-';
      uRam00000000001912d8._7_1_ = '-';
      DAT_001912c0 = '-';
      DAT_001912c0_1._0_1_ = '-';
      DAT_001912c0_1._1_1_ = '-';
      DAT_001912c0_1._2_1_ = '-';
      DAT_001912c0_1._3_1_ = '-';
      DAT_001912c0_1._4_1_ = '-';
      DAT_001912c0_1._5_1_ = '-';
      DAT_001912c0_1._6_1_ = '-';
      uRam00000000001912c8._0_1_ = '-';
      uRam00000000001912c8._1_1_ = '-';
      uRam00000000001912c8._2_1_ = '-';
      uRam00000000001912c8._3_1_ = '-';
      uRam00000000001912c8._4_1_ = '-';
      uRam00000000001912c8._5_1_ = '-';
      uRam00000000001912c8._6_1_ = '-';
      uRam00000000001912c8._7_1_ = '-';
      getLineOfChars<(char)45>()::line = '-';
      getLineOfChars<(char)45>()::line_1._0_1_ = '-';
      getLineOfChars<(char)45>()::line_1._1_1_ = '-';
      getLineOfChars<(char)45>()::line_1._2_1_ = '-';
      getLineOfChars<(char)45>()::line_1._3_1_ = '-';
      getLineOfChars<(char)45>()::line_1._4_1_ = '-';
      getLineOfChars<(char)45>()::line_1._5_1_ = '-';
      getLineOfChars<(char)45>()::line_1._6_1_ = '-';
      uRam00000000001912b8._0_1_ = '-';
      uRam00000000001912b8._1_1_ = '-';
      uRam00000000001912b8._2_1_ = '-';
      uRam00000000001912b8._3_1_ = '-';
      uRam00000000001912b8._4_1_ = '-';
      uRam00000000001912b8._5_1_ = '-';
      uRam00000000001912b8._6_1_ = '-';
      uRam00000000001912b8._7_1_ = '-';
      DAT_001912ff = 0;
    }
    sVar5 = strlen(&getLineOfChars<(char)45>()::line);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,&getLineOfChars<(char)45>()::line,sVar5);
    local_90.m_strings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_90,1);
    clara::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_60.m_strings);
    clara::std::
    vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>::~vector
              (&local_a8.m_columns);
    in_EAX = extraout_EAX;
  }
  return in_EAX;
}

Assistant:

void open() {
        if (!m_isOpen) {
            m_isOpen = true;
            *this << RowBreak();

			Columns headerCols;
			Spacer spacer(2);
			for (auto const& info : m_columnInfos) {
				headerCols += Column(info.name).width(static_cast<std::size_t>(info.width - 2));
				headerCols += spacer;
			}
			m_os << headerCols << '\n';

            m_os << Catch::getLineOfChars<'-'>() << '\n';
        }
    }